

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O0

void pzgeom::TPZQuadraticPyramid::TShape<double>
               (TPZVec<double> *par,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  TPZVec<double> *in_RDI;
  double col;
  double row;
  TPZFMatrix<double> *this;
  double check;
  double zeta;
  double eta;
  double qsi;
  int64_t in_stack_fffffffffffffe50;
  int64_t in_stack_fffffffffffffe58;
  TPZFMatrix<double> *in_stack_fffffffffffffe60;
  
  pdVar4 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_RDI,1);
  dVar2 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_RDI,2);
  dVar3 = *pdVar4;
  if (1e-06 <= ABS(dVar3 - 1.0)) {
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = ((dVar2 + 1.0 + dVar1) * (dVar2 + -1.0 + dVar3) * (dVar1 + -1.0 + dVar3)) /
              ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -(((dVar2 + 1.0) - dVar1) * ((dVar1 + 1.0) - dVar3) * (dVar2 + -1.0 + dVar3)) /
              ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -((dVar2 + -1.0 + dVar1) * ((dVar2 + 1.0) - dVar3) * ((dVar1 + 1.0) - dVar3)) /
              ((dVar3 + -1.0) * 4.0);
    col = (((dVar2 + -1.0) - dVar1) * ((dVar2 + 1.0) - dVar3) * (dVar1 + -1.0 + dVar3)) /
          ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(int64_t)col);
    *pdVar4 = col;
    row = dVar3 * (dVar3 + dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(in_stack_fffffffffffffe60,(int64_t)row,(int64_t)col);
    *pdVar4 = row;
    this = (TPZFMatrix<double> *)
           (((dVar2 + -1.0 + dVar3) * ((-1.0 - dVar1) + dVar3) * (dVar1 + -1.0 + dVar3)) /
           ((dVar3 + -1.0) * 2.0));
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (double)this;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (((-1.0 - dVar2) + dVar3) * (dVar2 + -1.0 + dVar3) * ((-1.0 - dVar1) + dVar3)) /
              ((dVar3 + -1.0) * 2.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = ((dVar1 * dVar1 + -((dVar3 + -1.0) * (dVar3 + -1.0))) * ((dVar2 + 1.0) - dVar3)) /
              ((dVar3 + -1.0) * 2.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = ((-dVar2 * dVar2 + (dVar3 + -1.0) * (dVar3 + -1.0)) * (dVar1 + -1.0 + dVar3)) /
              ((dVar3 + -1.0) * 2.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -((dVar3 * (dVar2 + -1.0 + dVar3) * (dVar1 + -1.0 + dVar3)) / (dVar3 + -1.0));
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -((dVar3 * (dVar2 + -1.0 + dVar3) * ((-1.0 - dVar1) + dVar3)) / (dVar3 + -1.0));
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (((dVar2 + 1.0) - dVar3) * ((dVar1 + 1.0) - dVar3) * dVar3) / (1.0 - dVar3);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -((dVar3 * ((-1.0 - dVar2) + dVar3) * (dVar1 + -1.0 + dVar3)) / (dVar3 + -1.0));
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = ((dVar2 + -1.0 + dVar3) * (dVar1 + dVar1 + dVar2 + dVar3)) / ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = ((dVar1 + -1.0 + dVar3) * (dVar2 + dVar2 + dVar1 + dVar3)) / ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -(-(dVar1 + 1.0) * (dVar3 + -1.0) * (dVar3 + -1.0) +
               dVar2 * dVar2 * dVar1 +
               dVar2 * (-(dVar3 + -1.0) * (dVar3 + -1.0) + dVar1 * dVar1 + dVar1)) /
              ((dVar3 + -1.0) * (dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -((dVar2 + -1.0 + dVar3) * ((dVar2 - (dVar1 + dVar1)) + dVar3)) /
              ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (((dVar1 + 1.0) - dVar3) * ((dVar1 - (dVar2 + dVar2)) - dVar3)) /
              ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (-(dVar1 + -1.0) * (dVar3 + -1.0) * (dVar3 + -1.0) +
              dVar2 * dVar2 * dVar1 +
              dVar2 * ((dVar3 + -1.0) * (dVar3 + -1.0) + -dVar1 * dVar1 + dVar1)) /
              ((dVar3 + -1.0) * (dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -(((dVar2 + 1.0) - dVar3) * ((dVar1 + dVar1 + dVar2) - dVar3)) /
              ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -(((dVar1 + 1.0) - dVar3) * ((dVar2 + dVar2 + dVar1) - dVar3)) /
              ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (-(dVar1 + -1.0) * (dVar3 + -1.0) * (dVar3 + -1.0) +
              dVar2 * dVar2 * dVar1 +
              dVar2 * (-(dVar3 + -1.0) * (dVar3 + -1.0) + dVar1 * dVar1 + -dVar1)) /
              ((dVar3 + -1.0) * (dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (((dVar2 + 1.0) - dVar3) * ((dVar2 - (dVar1 + dVar1)) - dVar3)) /
              ((dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (((dVar2 + dVar2 + -dVar1) - dVar3) * (dVar1 + -1.0 + dVar3)) / ((dVar3 + -1.0) * 4.0)
    ;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = ((dVar1 + 1.0) * (dVar3 + -1.0) * (dVar3 + -1.0) +
              -(dVar2 * dVar2) * dVar1 +
              dVar2 * (-(dVar3 + -1.0) * (dVar3 + -1.0) + dVar1 * dVar1 + dVar1)) /
              ((dVar3 + -1.0) * (dVar3 + -1.0) * 4.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = dVar3 * 4.0 + -1.0;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -((dVar1 * (dVar2 + -1.0 + dVar3)) / (dVar3 + -1.0));
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (-dVar1 * dVar1 + (dVar3 + -1.0) * (dVar3 + -1.0)) / ((dVar3 + -1.0) * 2.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar3 + dVar3 +
              dVar2 + -2.0 + (dVar2 * dVar1 * dVar1) / ((dVar3 + -1.0) * (dVar3 + -1.0))) / 2.0;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar2 * dVar2 + -((dVar3 + -1.0) * (dVar3 + -1.0))) / ((dVar3 + -1.0) * 2.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar2 * ((dVar1 + 1.0) - dVar3)) / (dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = dVar1 * (-0.5 - (dVar2 * dVar2) / ((dVar3 + -1.0) * (dVar3 + -1.0) * 2.0)) + -1.0 +
              dVar3;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar1 * ((dVar2 + 1.0) - dVar3)) / (dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar1 * dVar1 + -((dVar3 + -1.0) * (dVar3 + -1.0))) / ((dVar3 + -1.0) * 2.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = dVar2 * (-0.5 - (dVar1 * dVar1) / ((dVar3 + -1.0) * (dVar3 + -1.0) * 2.0)) + -1.0 +
              dVar3;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (-dVar2 * dVar2 + (dVar3 + -1.0) * (dVar3 + -1.0)) / ((dVar3 + -1.0) * 2.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -((dVar2 * (dVar1 + -1.0 + dVar3)) / (dVar3 + -1.0));
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar3 + dVar3 +
              dVar1 + -2.0 + (dVar2 * dVar2 * dVar1) / ((dVar3 + -1.0) * (dVar3 + -1.0))) / 2.0;
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -((dVar3 * (dVar2 + -1.0 + dVar3)) / (dVar3 + -1.0));
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = -((dVar3 * (dVar1 + -1.0 + dVar3)) / (dVar3 + -1.0));
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar2 * (dVar1 / ((dVar3 + -1.0) * (dVar3 + -1.0)) + -1.0) + (1.0 - dVar1)) -
              (dVar3 + dVar3);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar3 * (dVar2 + -1.0 + dVar3)) / (dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (((dVar1 + 1.0) - dVar3) * dVar3) / (dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar2 * (-1.0 - dVar1 / ((dVar3 + -1.0) * (dVar3 + -1.0))) + dVar1 + 1.0) -
              (dVar3 + dVar3);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar3 * ((-1.0 - dVar2) + dVar3)) / (dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar3 * ((-1.0 - dVar1) + dVar3)) / (dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar2 + 1.0 + dVar1 + (dVar2 * dVar1) / ((dVar3 + -1.0) * (dVar3 + -1.0))) -
              (dVar3 + dVar3);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (((dVar2 + 1.0) - dVar3) * dVar3) / (dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (dVar3 * (dVar1 + -1.0 + dVar3)) / (dVar3 + -1.0);
    pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
    *pdVar4 = (((dVar2 + 1.0) - dVar1) - (dVar2 * dVar1) / ((dVar3 + -1.0) * (dVar3 + -1.0))) -
              (dVar3 + dVar3);
  }
  else {
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -0.25;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -0.25;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -0.25;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -0.25;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 3.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = 1.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    *pdVar4 = -1.0;
  }
  return;
}

Assistant:

void TPZQuadraticPyramid::TShape(const TPZVec<T> &par,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = par[0], eta = par[1], zeta = par[2];
    T check = zeta-1.;
    if(fabs(check) < 1.E-6)
    {
        phi(0,0)  = 0.;
        phi(1,0)  = 0.;
        phi(2,0)  = 0.;
        phi(3,0)  = 0.;
        phi(4,0)  = 1.;
        phi(5,0)  = 0.;
        phi(6,0)  = 0.;
        phi(7,0)  = 0.;
        phi(8,0)  = 0.;
        phi(9,0)  = 0.;
        phi(10,0) = 0.;
        phi(11,0) = 0.;
        phi(12,0) = 0.;
        
        dphi(0,0) = 0.;
        dphi(1,0) = 0.;
        dphi(2,0) = -0.25;
        
        dphi(0,1) = 0.;
        dphi(1,1) = 0.;
        dphi(2,1) = -0.25;
        
        dphi(0,2) = 0.;
        dphi(1,2) = 0.;
        dphi(2,2) = -0.25;
        
        dphi(0,3) = 0.;
        dphi(1,3) = 0.;
        dphi(2,3) = -0.25;
        
        dphi(0,4) = 0.;
        dphi(1,4) = 0.;
        dphi(2,4) = 3.;
        
        dphi(0,5) = 0.;
        dphi(1,5) = 0.5;
        dphi(2,5) = 0.5;
        
        dphi(0,6) = -0.5;
        dphi(1,6) = 0.;
        dphi(2,6) = 0.5;
        
        dphi(0,7) = 0.;
        dphi(1,7) = -0.5;
        dphi(2,7) = 0.5;
        
        dphi(0,8) = 0.5;
        dphi(1,8) = 0.;
        dphi(2,8) = 0.5;
        
        dphi(0,9) = -1.;
        dphi(1,9) = -1.;
        dphi(2,9) = -1.;
        
        dphi(0,10) = 1.;
        dphi(1,10) = -1.;
        dphi(2,10) = -1.;
        
        dphi(0,11) = 1.;
        dphi(1,11) = 1.;
        dphi(2,11) = -1.;
        
        dphi(0,12) = -1;
        dphi(1,12) = 1.;
        dphi(2,12) = -1.;
        
        return;
    }

    phi(0,0) = ((1 + eta + qsi)*(-1 + eta + zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(1,0) = -((1 + eta - qsi)*(1 + qsi - zeta)*(-1 + eta + zeta))/(4.*(-1 + zeta));
    phi(2,0) = -((-1 + eta + qsi)*(1 + eta - zeta)*(1 + qsi - zeta))/(4.*(-1 + zeta));
    phi(3,0) = ((-1 + eta - qsi)*(1 + eta - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(4,0) = zeta*(-1 + 2*zeta);
    phi(5,0) = ((-1 + eta + zeta)*(-1 - qsi + zeta)*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(6,0) = ((-1 - eta + zeta)*(-1 + eta + zeta)*(-1 - qsi + zeta))/(2.*(-1 + zeta));
    phi(7,0) = ((qsi*qsi - (-1 + zeta)*(-1 + zeta))*(1 + eta - zeta))/(2.*(-1 + zeta));
    phi(8,0) = ((-(eta*eta) + (-1 + zeta)*(-1 + zeta))*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(9,0) = -((zeta*(-1 + eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));
    phi(10,0) = -((zeta*(-1 + eta + zeta)*(-1 - qsi + zeta))/(-1 + zeta));
    phi(11,0) = ((1 + eta - zeta)*(1 + qsi - zeta)*zeta)/(1 - zeta);
    phi(12,0) = -((zeta*(-1 - eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));


    dphi(0,0) = ((-1 + eta + zeta)*(eta + 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,0) = ((-1 + qsi + zeta)*(2*eta + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,0) = -(eta*eta*qsi + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,1) = -((-1 + eta + zeta)*(eta - 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,1) = ((1 + qsi - zeta)*(-2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,1) = (eta*eta*qsi + eta*(qsi - qsi*qsi + (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,2) = -((1 + eta - zeta)*(eta + 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,2) = -((1 + qsi - zeta)*(2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,2) = (eta*eta*qsi + eta*(-qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,3) = ((1 + eta - zeta)*(eta - 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,3) = ((2*eta - qsi - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,3) = (-(eta*eta*qsi) + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) + (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,4) = 0;
    dphi(1,4) = 0;
    dphi(2,4) = -1 + 4*zeta;

    dphi(0,5) = -((qsi*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,5) = (-(qsi*qsi) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,5) = (-2 + eta + (eta*(qsi*qsi))/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,6) = (eta*eta - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,6) = (eta*(1 + qsi - zeta))/(-1 + zeta);
    dphi(2,6) = -1 + qsi*(-0.5 - (eta*eta)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,7) = (qsi*(1 + eta - zeta))/(-1 + zeta);
    dphi(1,7) = (qsi*qsi - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,7) = -1 + eta*(-0.5 - (qsi*qsi)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,8) = (-(eta*eta) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,8) = -((eta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,8) = (-2 + qsi + (eta*eta*qsi)/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,9) = -((zeta*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,9) = -((zeta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,9) = 1 - qsi + eta*(-1 + qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,10) = (zeta*(-1 + eta + zeta))/(-1 + zeta);
    dphi(1,10) = ((1 + qsi - zeta)*zeta)/(-1 + zeta);
    dphi(2,10) = 1 + qsi + eta*(-1 - qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,11) = (zeta*(-1 - eta + zeta))/(-1 + zeta);
    dphi(1,11) = (zeta*(-1 - qsi + zeta))/(-1 + zeta);
    dphi(2,11) = 1 + eta + qsi + (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;

    dphi(0,12) = ((1 + eta - zeta)*zeta)/(-1 + zeta);
    dphi(1,12) = (zeta*(-1 + qsi + zeta))/(-1 + zeta);
    dphi(2,12) = 1 + eta - qsi - (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;
    
}